

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

u_char * ngx_strstrn(u_char *s1,char *s2,size_t n)

{
  u_char uVar1;
  int iVar2;
  u_char *puVar3;
  
  uVar1 = *s2;
  do {
    puVar3 = s1;
    if (*puVar3 == '\0') {
      return (u_char *)0x0;
    }
    s1 = puVar3 + 1;
  } while ((*puVar3 != uVar1) || (iVar2 = strncmp((char *)s1,s2 + 1,n), iVar2 != 0));
  return puVar3;
}

Assistant:

u_char *
ngx_strstrn(u_char *s1, char *s2, size_t n)
{
    u_char  c1, c2;

    c2 = *(u_char *) s2++;

    do {
        do {
            c1 = *s1++;

            if (c1 == 0) {
                return NULL;
            }

        } while (c1 != c2);

    } while (ngx_strncmp(s1, (u_char *) s2, n) != 0);

    return --s1;
}